

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWTextureCoordinateBinding.h
# Opt level: O2

void __thiscall
COLLADAFW::TextureCoordinateBinding::~TextureCoordinateBinding(TextureCoordinateBinding *this)

{
  ~TextureCoordinateBinding(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

virtual ~TextureCoordinateBinding() {}